

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_game.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_game::save(xr_level_game *this,xr_writer *w)

{
  xr_writer::open_chunk(w,0x1000);
  xr_writer::
  w_chunks<std::vector<xray_re::way_path*,std::allocator<xray_re::way_path*>>,xray_re::way_path_io>
            (w,&this->m_paths);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x2000);
  xr_writer::
  w_chunks<std::vector<xray_re::mp_rpoint*,std::allocator<xray_re::mp_rpoint*>>,xray_re::mp_rpoint_io>
            (w,&this->m_rpoints);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_level_game::save(xr_writer& w) const
{
	w.open_chunk(GAME_CHUNK_WAYS);
	w.w_chunks(m_paths, way_path_io());
	w.close_chunk();

	w.open_chunk(GAME_CHUNK_RPOINTS);
	w.w_chunks(m_rpoints, mp_rpoint_io());
	w.close_chunk();
}